

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Key(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
      *this,Ch *str,SizeType len,bool copy)

{
  bool bVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  bool bVar4;
  ulong uVar5;
  char *pcVar6;
  uchar *d;
  
  if (this->valid_ != true) {
    return false;
  }
  AppendToken(this,str,len);
  pcVar6 = (this->schemaStack_).stackTop_;
  if ((ulong)((long)pcVar6 - (long)(this->schemaStack_).stack_) < 0x90) {
    __assert_fail("GetSize() >= sizeof(T)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x98,
                  "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                 );
  }
  bVar1 = internal::
          Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
          ::Key(*(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                  **)(pcVar6 + -0x80),(Context *)(pcVar6 + -0x90),str,len,copy);
  if (!bVar1) {
    bVar4 = false;
    bVar1 = false;
    if ((this->flags_ & 1) == 0) goto LAB_0012c30b;
  }
  pcVar6 = (this->schemaStack_).stack_;
  if (pcVar6 != (this->schemaStack_).stackTop_) {
    do {
      if (*(Stack<rapidjson::CrtAllocator> **)(pcVar6 + 0x38) !=
          (Stack<rapidjson::CrtAllocator> *)0x0) {
        uVar5 = 0xaf63b84c8601af60;
        if (len != 0) {
          uVar5 = 0xaf63b84c8601af60;
          uVar2 = 0;
          do {
            uVar5 = ((byte)str[uVar2] ^ uVar5) * 0x100000001b3;
            uVar2 = uVar2 + 1;
          } while (len != uVar2);
        }
        puVar3 = internal::Stack<rapidjson::CrtAllocator>::Push<unsigned_long>
                           (*(Stack<rapidjson::CrtAllocator> **)(pcVar6 + 0x38),1);
        *puVar3 = uVar5;
      }
      if ((*(long *)(pcVar6 + 0x48) != 0) && (*(int *)(pcVar6 + 0x50) != 0)) {
        uVar5 = 0;
        do {
          Key((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *)(*(long *)(*(long *)(pcVar6 + 0x48) + uVar5 * 8) + -8),str,len,copy);
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(uint *)(pcVar6 + 0x50));
      }
      if ((*(long *)(pcVar6 + 0x58) != 0) && (*(int *)(pcVar6 + 0x60) != 0)) {
        uVar5 = 0;
        do {
          Key((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *)(*(long *)(*(long *)(pcVar6 + 0x58) + uVar5 * 8) + -8),str,len,copy);
          uVar5 = uVar5 + 1;
        } while (uVar5 < *(uint *)(pcVar6 + 0x60));
      }
      pcVar6 = pcVar6 + 0x90;
    } while (pcVar6 != (this->schemaStack_).stackTop_);
  }
  bVar4 = true;
  bVar1 = true;
LAB_0012c30b:
  this->valid_ = bVar4;
  return bVar1;
}

Assistant:

bool Key(const Ch* str, SizeType len, bool copy) {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::Key", str);
        if (!valid_) return false;
        AppendToken(str, len);
        if (!CurrentSchema().Key(CurrentContext(), str, len, copy) && !GetContinueOnErrors()) {
            valid_ = false;
            return valid_;
        }
        RAPIDJSON_SCHEMA_HANDLE_PARALLEL_(Key, (str, len, copy));
        valid_ = !outputHandler_ || outputHandler_->Key(str, len, copy);
        return valid_;
    }